

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyPoint2Point.cpp
# Opt level: O1

int __thiscall btMultiBodyPoint2Point::getIslandIdB(btMultiBodyPoint2Point *this)

{
  bool bVar1;
  btMultibodyLink *pbVar2;
  long lVar3;
  long lVar4;
  btMultiBodyLinkCollider *pbVar5;
  
  if (this->m_rigidBodyB != (btRigidBody *)0x0) {
    return (this->m_rigidBodyB->super_btCollisionObject).m_islandTag1;
  }
  pbVar2 = (btMultibodyLink *)(this->super_btMultiBodyConstraint).m_bodyB;
  if (pbVar2 != (btMultibodyLink *)0x0) {
    pbVar5 = *(btMultiBodyLinkCollider **)((long)&pbVar2->m_inertiaLocal + 4);
    if (pbVar5 == (btMultiBodyLinkCollider *)0x0) {
      lVar3 = (long)*(int *)((long)pbVar2->m_axes + 0xc);
      bVar1 = true;
      if (0 < lVar3) {
        pbVar2 = *(btMultibodyLink **)((long)pbVar2->m_axes + 0x18);
        lVar4 = 0;
        do {
          pbVar5 = *(btMultiBodyLinkCollider **)((long)pbVar2->m_jointTorque + lVar4 + 0x1cU);
          if (pbVar5 != (btMultiBodyLinkCollider *)0x0) goto LAB_001ceb38;
          lVar4 = lVar4 + 600;
        } while (lVar3 * 600 - lVar4 != 0);
      }
    }
    else {
LAB_001ceb38:
      pbVar2 = (btMultibodyLink *)(ulong)*(uint *)(pbVar5 + 0xe4);
      bVar1 = false;
    }
    if (!bVar1) {
      return (int)pbVar2;
    }
  }
  return -1;
}

Assistant:

int btMultiBodyPoint2Point::getIslandIdB() const
{
	if (m_rigidBodyB)
		return m_rigidBodyB->getIslandTag();
	if (m_bodyB)
	{
		btMultiBodyLinkCollider* col = m_bodyB->getBaseCollider();
		if (col)
			return col->getIslandTag();

		for (int i=0;i<m_bodyB->getNumLinks();i++)
		{
			col = m_bodyB->getLink(i).m_collider;
			if (col)
				return col->getIslandTag();
		}
	}
	return -1;
}